

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_mpsadbw_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t offset)

{
  int iVar1;
  short local_70 [4];
  ZMMReg r;
  int i;
  int d0;
  int s0;
  uint32_t offset_local;
  ZMMReg *s_local;
  ZMMReg *d_local;
  CPUX86State *env_local;
  
  i = (offset & 3) << 2;
  r._l_ZMMReg[0xf] = offset & 4;
  d0 = offset;
  _s0 = s;
  s_local = d;
  d_local = (ZMMReg *)env;
  for (r._l_ZMMReg[0xe] = 0; (int)r._l_ZMMReg[0xe] < 8; r._l_ZMMReg[0xe] = r._l_ZMMReg[0xe] + 1) {
    local_70[(int)r._l_ZMMReg[0xe]] = 0;
    iVar1 = abs1((uint)s_local->_b_ZMMReg[(int)r._l_ZMMReg[0xf]] - (uint)_s0->_b_ZMMReg[i]);
    local_70[(int)r._l_ZMMReg[0xe]] = local_70[(int)r._l_ZMMReg[0xe]] + (short)iVar1;
    iVar1 = abs1((uint)s_local->_b_ZMMReg[(int)(r._l_ZMMReg[0xf] + 1)] - (uint)_s0->_b_ZMMReg[i + 1]
                );
    local_70[(int)r._l_ZMMReg[0xe]] = local_70[(int)r._l_ZMMReg[0xe]] + (short)iVar1;
    iVar1 = abs1((uint)s_local->_b_ZMMReg[(int)(r._l_ZMMReg[0xf] + 2)] - (uint)_s0->_b_ZMMReg[i + 2]
                );
    local_70[(int)r._l_ZMMReg[0xe]] = local_70[(int)r._l_ZMMReg[0xe]] + (short)iVar1;
    iVar1 = abs1((uint)s_local->_b_ZMMReg[(int)(r._l_ZMMReg[0xf] + 3)] - (uint)_s0->_b_ZMMReg[i + 3]
                );
    local_70[(int)r._l_ZMMReg[0xe]] = local_70[(int)r._l_ZMMReg[0xe]] + (short)iVar1;
    r._l_ZMMReg[0xf] = r._l_ZMMReg[0xf] + 1;
  }
  memcpy(s_local,local_70,0x40);
  return;
}

Assistant:

void glue(helper_mpsadbw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                  uint32_t offset)
{
    int s0 = (offset & 3) << 2;
    int d0 = (offset & 4) << 0;
    int i;
    Reg r;

    for (i = 0; i < 8; i++, d0++) {
        r.W(i) = 0;
        r.W(i) += abs1(d->B(d0 + 0) - s->B(s0 + 0));
        r.W(i) += abs1(d->B(d0 + 1) - s->B(s0 + 1));
        r.W(i) += abs1(d->B(d0 + 2) - s->B(s0 + 2));
        r.W(i) += abs1(d->B(d0 + 3) - s->B(s0 + 3));
    }

    *d = r;
}